

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall kratos::Simulator::init_pull_up_value(Simulator *this,Generator *generator)

{
  function<void_(kratos::AssignStmt_*)> local_a8;
  undefined1 local_88 [8];
  InitValueVisitor visitor;
  anon_class_8_1_8991fb9c fn;
  Generator *generator_local;
  Simulator *this_local;
  
  visitor.fn_._M_invoker = (_Invoker_type)this;
  std::function<void(kratos::AssignStmt*)>::
  function<kratos::Simulator::init_pull_up_value(kratos::Generator*)::__0&,void>
            ((function<void(kratos::AssignStmt*)> *)&local_a8,
             (anon_class_8_1_8991fb9c *)&visitor.fn_._M_invoker);
  InitValueVisitor::InitValueVisitor((InitValueVisitor *)local_88,&local_a8);
  std::function<void_(kratos::AssignStmt_*)>::~function(&local_a8);
  IRVisitor::visit_generator_root((IRVisitor *)local_88,generator);
  InitValueVisitor::~InitValueVisitor((InitValueVisitor *)local_88);
  return;
}

Assistant:

void Simulator::init_pull_up_value(Generator *generator) {
    auto fn = [&](AssignStmt *stmt) { this->process_stmt(stmt, nullptr); };
    InitValueVisitor visitor(fn);
    visitor.visit_generator_root(generator);
}